

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O0

MatchPattern * __thiscall
pfederc::Parser::parseMatchCase(MatchPattern *__return_storage_ptr__,Parser *this,bool *err)

{
  bool bVar1;
  TokenType type;
  Token *pTVar2;
  undefined1 local_c8 [24];
  undefined1 local_b0 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_90 [16];
  undefined1 local_80 [14];
  undefined2 local_72;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_70;
  undefined1 local_68 [16];
  Token *tokVarId;
  vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> vars;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_38;
  undefined1 local_30 [16];
  Token *tokId;
  bool *err_local;
  Parser *this_local;
  
  tokId = (Token *)err;
  err_local = (bool *)this;
  this_local = (Parser *)__return_storage_ptr__;
  local_30._8_8_ = Lexer::getCurrentToken(this->lexer);
  pTVar2 = Lexer::getCurrentToken(this->lexer);
  bVar1 = Token::operator!=(pTVar2,TOK_ID);
  if (bVar1) {
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    type = Token::getType(pTVar2);
    bVar1 = isNumberType(type);
    if (!bVar1) {
      pTVar2 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar2,TOK_CHAR);
      if (bVar1) {
        pTVar2 = Lexer::getCurrentToken(this->lexer);
        bVar1 = Token::operator!=(pTVar2,TOK_KW_TRUE);
        if (bVar1) {
          pTVar2 = Lexer::getCurrentToken(this->lexer);
          bVar1 = Token::operator!=(pTVar2,TOK_KW_FALSE);
          if (bVar1) {
            vars.super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 2;
            vars.super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x24;
            pTVar2 = Lexer::getCurrentToken(this->lexer);
            Token::getPosition(pTVar2);
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)&local_38,
                       (SyntaxErrorCode *)
                       ((long)&vars.
                               super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                       (Position *)
                       &vars.
                        super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            generateError((Parser *)local_30,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        local_30);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr(&local_38);
            pTVar2 = Lexer::getCurrentToken(this->lexer);
            bVar1 = Token::operator!=(pTVar2,TOK_OP_BRACKET_OPEN);
            if (bVar1) {
              pTVar2 = Lexer::getCurrentToken(this->lexer);
              bVar1 = Token::operator!=(pTVar2,TOK_IMPL);
              if (bVar1) {
                Lexer::next(this->lexer);
              }
            }
            local_30._8_8_ = (Token *)0x0;
            goto LAB_0013b289;
          }
        }
      }
    }
  }
  Lexer::next(this->lexer);
LAB_0013b289:
  std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::vector
            ((vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> *)&tokVarId);
  bVar1 = expect(this,TOK_OP_BRACKET_OPEN);
  if (bVar1) {
    do {
      skipEol(this);
      local_68._8_8_ = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=((Token *)local_68._8_8_,TOK_ID);
      if ((bVar1) && (bVar1 = Token::operator!=((Token *)local_68._8_8_,TOK_ANY), bVar1)) {
        local_72 = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_80._8_4_ = 0x25;
        pTVar2 = Lexer::getCurrentToken(this->lexer);
        Token::getPosition(pTVar2);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_70,(SyntaxErrorCode *)&local_72,(Position *)(local_80 + 8));
        generateError((Parser *)local_68,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_68);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_70);
        bVar1 = Token::operator!=((Token *)local_68._8_8_,TOK_OP_COMMA);
        if (bVar1) {
          Lexer::next(this->lexer);
        }
      }
      else {
        Lexer::next(this->lexer);
        std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::push_back
                  ((vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> *)
                   &tokVarId,(value_type *)(local_68 + 8));
      }
      bVar1 = expect(this,TOK_OP_COMMA);
    } while (bVar1);
    bVar1 = expect(this,TOK_BRACKET_CLOSE);
    if (!bVar1) {
      local_90._6_2_ = 2;
      local_90._0_4_ = 1;
      pTVar2 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar2);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_90 + 8),(SyntaxErrorCode *)(local_90 + 6),(Position *)local_90);
      generateError((Parser *)(local_90 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_90 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_90 + 8));
    }
  }
  bVar1 = expect(this,TOK_IMPL);
  if (!bVar1) {
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._6_2_ = 2;
    bodyExpr._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
    _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0x26;
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&stack0xffffffffffffff60,
               (SyntaxErrorCode *)
               ((long)&bodyExpr._M_t.
                       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                       .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 6),
               (Position *)&bodyExpr);
    generateError((Parser *)&stack0xffffffffffffff68,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffff68);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&stack0xffffffffffffff60);
  }
  skipEol(this);
  parseFunctionBody((Parser *)local_b0);
  bVar1 = expect(this,TOK_STMT);
  if (!bVar1) {
    local_c8._6_2_ = 2;
    local_c8._0_4_ = 0xc;
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_c8 + 8),(SyntaxErrorCode *)(local_c8 + 6),(Position *)local_c8);
    generateError((Parser *)(local_c8 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_c8 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_c8 + 8));
  }
  skipEol(this);
  std::
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ::
  tuple<const_pfederc::Token_*&,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_true,_true>
            (__return_storage_ptr__,(Token **)(local_30 + 8),
             (vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> *)&tokVarId,
             (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_b0);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_b0);
  std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::~vector
            ((vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> *)&tokVarId);
  return __return_storage_ptr__;
}

Assistant:

MatchPattern Parser::parseMatchCase(bool &err) noexcept {
  const Token *tokId = lexer.getCurrentToken();
  if (*lexer.getCurrentToken() != TokenType::TOK_ID
      && !isNumberType(lexer.getCurrentToken()->getType())
      && *lexer.getCurrentToken() != TokenType::TOK_CHAR
      && *lexer.getCurrentToken() != TokenType::TOK_KW_TRUE
      && *lexer.getCurrentToken() != TokenType::TOK_KW_FALSE) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL,
          lexer.getCurrentToken()->getPosition()));
    if (*lexer.getCurrentToken()  != TokenType::TOK_OP_BRACKET_OPEN
        && *lexer.getCurrentToken() != TokenType::TOK_IMPL)
      lexer.next(); // skip
    tokId = nullptr;
  } else {
    lexer.next();
  }

  std::vector<const Token *> vars;
  if (expect(TokenType::TOK_OP_BRACKET_OPEN)) {
    do {
      skipEol();
      const Token *const tokVarId = lexer.getCurrentToken();
      if (*tokVarId != TokenType::TOK_ID && *tokVarId != TokenType::TOK_ANY) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_EXPECTED_ID_ANY,
              lexer.getCurrentToken()->getPosition()));
        if (*tokVarId != TokenType::TOK_OP_COMMA)
          lexer.next();
      } else {
        lexer.next(); // eat id|any

        vars.push_back(tokVarId);
      }
    } while (expect(TokenType::TOK_OP_COMMA));

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
            lexer.getCurrentToken()->getPosition()));
    }
  }

  if (!expect(TokenType::TOK_IMPL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_OP_IMPL,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  return MatchPattern(tokId, std::move(vars), std::move(bodyExpr));
}